

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O0

CACHE_GROUP
Diligent::PipelineResourceSignatureVkImpl::GetResourceCacheGroup(PipelineResourceDesc *Res)

{
  PIPELINE_RESOURCE_FLAGS PVar1;
  PIPELINE_RESOURCE_FLAGS PVar2;
  DESCRIPTOR_SET_ID DVar3;
  bool UseTexelBuffer;
  bool WithDynamicOffset;
  size_t SetId;
  PipelineResourceDesc *Res_local;
  
  DVar3 = VarTypeToDescriptorSetId(Res->VarType);
  PVar1 = Diligent::operator&(Res->Flags,PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS);
  PVar2 = Diligent::operator&(Res->Flags,PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
  if ((PVar1 == PIPELINE_RESOURCE_FLAG_NONE) && (PVar2 == PIPELINE_RESOURCE_FLAG_NONE)) {
    if (Res->ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER) {
      return DVar3 * 3;
    }
    if ((Res->ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV) ||
       (Res->ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV)) {
      return DVar3 * 3 + CACHE_GROUP_DYN_SB;
    }
  }
  return DVar3 * 3 + CACHE_GROUP_OTHER;
}

Assistant:

inline PipelineResourceSignatureVkImpl::CACHE_GROUP PipelineResourceSignatureVkImpl::GetResourceCacheGroup(const PipelineResourceDesc& Res)
{
    // NB: SetId is always 0 for static/mutable variables, and 1 - for dynamic ones.
    //     It is not the actual descriptor set index in the set layout!
    const size_t SetId             = VarTypeToDescriptorSetId(Res.VarType);
    const bool   WithDynamicOffset = (Res.Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) == 0;
    const bool   UseTexelBuffer    = (Res.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != 0;

    if (WithDynamicOffset && !UseTexelBuffer)
    {
        if (Res.ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER)
            return static_cast<CACHE_GROUP>(SetId * CACHE_GROUP_COUNT_PER_VAR_TYPE + CACHE_GROUP_DYN_UB);

        if (Res.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV || Res.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV)
            return static_cast<CACHE_GROUP>(SetId * CACHE_GROUP_COUNT_PER_VAR_TYPE + CACHE_GROUP_DYN_SB);
    }
    return static_cast<CACHE_GROUP>(SetId * CACHE_GROUP_COUNT_PER_VAR_TYPE + CACHE_GROUP_OTHER);
}